

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O0

void __thiscall Dijkstra::run(Dijkstra *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  value_type vVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  reference pvVar10;
  ostream *poVar11;
  const_reference pvVar12;
  ulong uVar13;
  reference pvVar14;
  size_type sVar15;
  long *in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  reference rVar16;
  tuple new_node;
  int other;
  int e;
  uint i;
  int curr;
  tuple top;
  tuple initial;
  int count;
  vector<bool,_std::allocator<bool>_> vis;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *in_stack_fffffffffffffce0;
  allocator_type *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  value_type *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  tuple local_148;
  reference local_140;
  reference local_130;
  value_type local_11c;
  value_type local_118;
  uint local_114;
  reference local_110;
  reference local_100;
  int local_ec;
  value_type local_e8;
  tuple local_e0;
  undefined4 local_d4;
  undefined1 local_b1;
  undefined4 local_84;
  int local_68;
  undefined1 local_51;
  
  std::
  priority_queue<Dijkstra::tuple,std::vector<Dijkstra::tuple,std::allocator<Dijkstra::tuple>>,Dijkstra::Priority>
  ::priority_queue<std::vector<Dijkstra::tuple,std::allocator<Dijkstra::tuple>>,void>
            (in_stack_fffffffffffffce0);
  std::
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  ::operator=(in_stack_fffffffffffffce0,
              (priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
               *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  std::
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  ::~priority_queue((priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
                     *)0x29c93d);
  local_51 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x29c96e);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd00,
             (size_type)in_stack_fffffffffffffcf8,(bool *)in_stack_fffffffffffffcf0,
             (allocator_type *)in_stack_fffffffffffffce8);
  std::allocator<bool>::~allocator((allocator<bool> *)0x29c9a2);
  local_68 = 0;
  local_84 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x29c9e1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00,
             (size_type)in_stack_fffffffffffffcf8,(value_type_conflict *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0);
  std::allocator<int>::~allocator((allocator<int> *)0x29ca43);
  local_b1 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x29ca74);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd00,
             (size_type)in_stack_fffffffffffffcf8,(bool *)in_stack_fffffffffffffcf0,
             (allocator_type *)in_stack_fffffffffffffce8);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffcf0,
             (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffce8);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x29cac9)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x29cad6);
  local_d4 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x29cb0a);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00,
             (size_type)in_stack_fffffffffffffcf8,(value_type_conflict *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffce8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0);
  std::allocator<int>::~allocator((allocator<int> *)0x29cb6f);
  lVar2 = in_RDI[1];
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)(int)lVar2);
  *pvVar10 = (int)lVar2;
  vVar6 = (**(code **)(*in_RDI + 0x48))(in_RDI,(int)in_RDI[1]);
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),(long)(int)in_RDI[1]);
  *pvVar10 = vVar6;
  lVar2 = in_RDI[1];
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),(long)(int)lVar2);
  tuple::tuple(&local_e0,(int)lVar2,*pvVar10);
  std::
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  ::push((priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
          *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  if ((*(byte *)(in_RDI + 0x1f) & 1) != 0) {
    poVar11 = std::operator<<((ostream *)&std::cout,"START");
    std::operator<<(poVar11,'\n');
  }
  do {
    do {
      bVar3 = std::
              priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
              ::empty((priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
                       *)0x29cd4c);
      bVar4 = false;
      if (!bVar3) {
        bVar4 = local_68 < *(int *)((long)in_RDI + 0xc);
      }
      if (!bVar4) {
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x29d665);
        return;
      }
      pvVar12 = std::
                priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
                ::top((priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
                       *)0x29cdac);
      local_e8 = *pvVar12;
      std::
      priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
      ::pop((priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
             *)in_stack_fffffffffffffcf0);
      local_ec = local_e8.node;
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd00,
                          (size_type)in_stack_fffffffffffffcf8);
      local_100 = rVar16;
      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_100);
    } while (bVar4);
    (**(code **)(*in_RDI + 0x18))(in_RDI,local_ec);
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd00,
                        (size_type)in_stack_fffffffffffffcf8);
    local_110 = rVar16;
    std::_Bit_reference::operator=(&local_110,true);
    local_68 = local_68 + 1;
    if ((*(byte *)(in_RDI + 0x1f) & 1) != 0) {
      poVar11 = std::operator<<((ostream *)&std::cout,"Visiting ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_ec);
      poVar11 = std::operator<<(poVar11," from ");
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_ec);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
      poVar11 = std::operator<<(poVar11,"(cost: ");
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),(long)local_ec);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
      poVar11 = std::operator<<(poVar11,")");
      std::operator<<(poVar11,'\n');
    }
    local_114 = 0;
    while( true ) {
      uVar13 = (ulong)local_114;
      pvVar14 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 8),(long)local_ec);
      sVar15 = std::vector<int,_std::allocator<int>_>::size(pvVar14);
      if (sVar15 <= uVar13) break;
      pvVar14 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(in_RDI + 8),(long)local_ec);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar14,(ulong)local_114);
      local_118 = *pvVar10;
      bVar5 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_118);
      if ((bVar5 & 1) == 0) {
        iVar7 = (**(code **)(*in_RDI + 0x40))(in_RDI,local_118,0xffffffff);
        if (iVar7 < 0) goto LAB_0029d0dd;
        pvVar14 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)(in_RDI + 2),(long)local_118);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar14,1);
        local_11c = *pvVar10;
        bVar5 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_11c);
        if ((bVar5 & 1) == 0) {
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd00,
                              (size_type)in_stack_fffffffffffffcf8);
          local_130 = rVar16;
          bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_130);
          if (!bVar4) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),
                                 (long)local_11c);
            if (*pvVar10 != -1) {
              this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x13);
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_11c);
              iVar7 = *pvVar10;
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_ec);
              vVar6 = local_118;
              iVar1 = *pvVar10;
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_ec);
              iVar8 = (**(code **)(*in_RDI + 0x40))(in_RDI,vVar6,*pvVar10);
              iVar9 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_11c);
              if (iVar7 <= iVar1 + iVar8 + iVar9) goto LAB_0029d63d;
            }
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),(long)local_ec
                                );
            vVar6 = local_118;
            iVar7 = *pvVar10;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),(long)local_ec
                                );
            iVar8 = (**(code **)(*in_RDI + 0x40))(in_RDI,vVar6,*pvVar10);
            iVar9 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_11c);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),
                                 (long)local_11c);
            iVar1 = local_ec;
            *pvVar10 = iVar7 + iVar8 + iVar9;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_11c
                                );
            *pvVar10 = iVar1;
            rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd00,
                                (size_type)in_stack_fffffffffffffcf8);
            local_140 = rVar16;
            std::_Bit_reference::operator=(&local_140,true);
            if ((*(byte *)(in_RDI + 0x1f) & 1) != 0) {
              poVar11 = std::operator<<((ostream *)&std::cout,"Marked ");
              in_stack_fffffffffffffd00 = (ostream *)std::ostream::operator<<(poVar11,local_11c);
              in_stack_fffffffffffffcf8 =
                   (value_type *)std::operator<<(in_stack_fffffffffffffd00," from ");
              in_stack_fffffffffffffcf0 =
                   (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcf8,local_ec);
              poVar11 = std::operator<<(in_stack_fffffffffffffcf0," of cost ");
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),
                                   (long)local_11c);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
              std::operator<<(poVar11,'\n');
            }
            vVar6 = local_11c;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13),
                                 (long)local_11c);
            tuple::tuple(&local_148,vVar6,*pvVar10);
            (**(code **)(*in_RDI + 0x38))(in_RDI,local_148);
          }
        }
      }
      else {
LAB_0029d0dd:
        if ((*(byte *)(in_RDI + 0x1f) & 1) != 0) {
          poVar11 = std::operator<<((ostream *)&std::cout,"Ignoring edge ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_118);
          poVar11 = std::operator<<(poVar11," from ");
          pvVar14 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)(in_RDI + 2),(long)local_118);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar14,0);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
          poVar11 = std::operator<<(poVar11," to ");
          pvVar14 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)(in_RDI + 2),(long)local_118);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar14,1);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
          std::operator<<(poVar11,'\n');
        }
        (**(code **)(*in_RDI + 0x28))(in_RDI,local_118);
      }
LAB_0029d63d:
      local_114 = local_114 + 1;
    }
  } while( true );
}

Assistant:

void Dijkstra::run() {
	q = std::priority_queue<tuple, std::vector<tuple>, Dijkstra::Priority>();
	std::vector<bool> vis = std::vector<bool>(nb_nodes, false);

	int count = 0;

	pred = std::vector<int>(nb_nodes, -1);
	has_kids = std::vector<bool>(nb_nodes, false);
	cost = std::vector<int>(nb_nodes, -1);

	pred[source] = source;
	cost[source] = duration(source);
	const tuple initial(source, cost[source]);
	q.push(initial);

	if (verbose) {
		std::cout << "START" << '\n';
	}

	while (!q.empty() && count < nb_nodes) {
		const tuple top = q.top();
		q.pop();
		const int curr = top.node;

		if (vis[curr]) {
			continue;
		}

		on_visiting_node(curr);
		vis[curr] = true;
		count++;

		if (verbose) {
			std::cout << "Visiting " << curr << " from " << pred[curr] << "(cost: " << cost[curr] << ")"
								<< '\n';
		}

		for (unsigned int i = 0; i < out[curr].size(); i++) {
			const int e = out[curr][i];
			assert(en[e][0] == curr);
			if (ignore_edge(e) || weight(e) < 0) {
				if (verbose) {
					std::cout << "Ignoring edge " << e << " from " << en[e][0] << " to " << en[e][1] << '\n';
				}
				on_ignore_edge(e);
				continue;
			}
			const int other = en[e][1];  // Head of e

			if (ignore_node(other)) {
				continue;
			}
			if (vis[other]) {
				continue;
			}

			if (cost[other] == -1 || cost[other] > cost[curr] + weight(e, cost[curr]) + duration(other)) {
				cost[other] = cost[curr] + weight(e, cost[curr]) + duration(other);
				assert(cost[other] != -1);
				pred[other] = curr;
				has_kids[curr] = true;
				if (verbose) {
					std::cout << "Marked " << other << " from " << curr << " of cost " << cost[other] << '\n';
				}
				const tuple new_node(other, cost[other]);
				enqueue(new_node);
			}
		}
	}
}